

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

string * __thiscall
czh::utils::fill_double_abi_cxx11_(string *__return_storage_ptr__,utils *this,double v)

{
  string local_70;
  undefined1 local_40 [8];
  string buffer;
  int K;
  double v_local;
  
  std::__cxx11::string::string((string *)local_40);
  grisu2(v,(string *)local_40,(int *)(buffer.field_2._M_local_buf + 0xc));
  prettify_string(&local_70,(string *)local_40,buffer.field_2._12_4_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string fill_double(double v)
  {
    int K;
    std::string buffer;
    grisu2(v, buffer, K);
    return std::move(prettify_string(buffer, K));
  }